

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

CK_RV __thiscall Session::getInfo(Session *this,CK_SESSION_INFO_PTR pInfo)

{
  bool bVar1;
  CK_SLOT_ID CVar2;
  CK_STATE CVar3;
  CK_SLOT_ID *in_RSI;
  Session *in_RDI;
  Session *in_stack_ffffffffffffffd8;
  CK_RV local_8;
  
  if (in_RSI == (CK_SLOT_ID *)0x0) {
    local_8 = 7;
  }
  else {
    CVar2 = Slot::getSlotID(in_RDI->slot);
    *in_RSI = CVar2;
    CVar3 = getState(in_stack_ffffffffffffffd8);
    in_RSI[1] = CVar3;
    in_RSI[2] = 4;
    bVar1 = isRW(in_RDI);
    if (bVar1) {
      in_RSI[2] = in_RSI[2] | 2;
    }
    in_RSI[3] = 0;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

CK_RV Session::getInfo(CK_SESSION_INFO_PTR pInfo)
{
	if (pInfo == NULL_PTR) return CKR_ARGUMENTS_BAD;

	pInfo->slotID = slot->getSlotID();

	pInfo->state = getState();
	pInfo->flags = CKF_SERIAL_SESSION;
	if (isRW())
	{
		pInfo->flags |= CKF_RW_SESSION;
	}
	pInfo->ulDeviceError = 0;

	return CKR_OK;
}